

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrintFloat(UNITY_DOUBLE input_number)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  char *string;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  char buf [16];
  char acStack_3a [26];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((input_number < 0.0) ||
     (((input_number == 0.0 && (!NAN(input_number))) && (1.0 / input_number < 0.0)))) {
    putchar(0x2d);
    input_number = -input_number;
  }
  if ((input_number != 0.0) || (NAN(input_number))) {
    if (NAN(input_number)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        string = "nan";
        goto LAB_00106796;
      }
    }
    else if (ABS(input_number) == INFINITY) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        string = "inf";
        goto LAB_00106796;
      }
    }
    else {
      iVar4 = 0;
      if (input_number < 0.10000000149011612) {
        iVar4 = 0;
        do {
          input_number = input_number * 1000000.0;
          iVar4 = iVar4 + -6;
        } while (input_number < 0.10000000149011612);
      }
      for (; input_number < 100000.0; input_number = input_number * 10.0) {
        iVar4 = iVar4 + -1;
      }
      for (; 999999995904.0 < input_number; input_number = input_number / 1000000.0) {
        iVar4 = iVar4 + 6;
      }
      for (; 1000000.0 < input_number; input_number = input_number / 10.0) {
        iVar4 = iVar4 + 1;
      }
      iVar1 = (int)(input_number + input_number);
      iVar3 = 100000;
      if (iVar1 < 1999999) {
        iVar3 = (iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1;
      }
      iVar2 = iVar4 + (uint)(0x1e847e < iVar1);
      uVar7 = 5;
      if (iVar4 + (uint)(0x1e847e < iVar1) + 9 < 10) {
        uVar7 = -iVar2;
      }
      uVar6 = uVar7;
      if (0 < (int)uVar7) {
        do {
          if (iVar3 % 10 != 0) break;
          iVar3 = iVar3 / 10;
          uVar5 = uVar6 - 1;
          bVar11 = 1 < (int)uVar6;
          uVar6 = uVar5;
        } while (bVar11);
      }
      if ((iVar3 != 0) || (uVar10 = 0, -1 < (int)uVar6)) {
        uVar10 = 0;
        do {
          do {
            uVar8 = uVar10;
            iVar4 = iVar3 / 10;
            uVar10 = uVar8 + 1;
            acStack_3a[uVar8 + 2] = (char)iVar3 + (char)iVar4 * -10 + '0';
            uVar5 = iVar3 - 10;
            iVar3 = iVar4;
          } while (uVar5 < 0xffffffed);
        } while ((long)uVar8 < (long)(int)uVar6);
      }
      uVar7 = uVar7 + iVar2;
      if (0 < (int)uVar10) {
        lVar9 = (uVar10 & 0xffffffff) + 1;
        do {
          if (lVar9 - (ulong)uVar6 == 1) {
            putchar(0x2e);
          }
          putchar((int)acStack_3a[lVar9]);
          lVar9 = lVar9 + -1;
        } while (1 < lVar9);
      }
      if (uVar7 != 0) {
        putchar(0x65);
        if ((int)uVar7 < 0) {
          putchar(0x2d);
          uVar7 = -uVar7;
        }
        else {
          putchar(0x2b);
        }
        uVar10 = 0xffffffffffffffff;
        do {
          acStack_3a[uVar10 + 3] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
          bVar11 = 9 < uVar7;
          uVar10 = uVar10 + 1;
          uVar7 = uVar7 / 10;
        } while (uVar10 == 0 || bVar11);
        do {
          putchar((int)acStack_3a[(uVar10 & 0xffffffff) + 2]);
          uVar10 = uVar10 - 1;
        } while (1 < (int)uVar10 + 2);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        return;
      }
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    string = "0";
LAB_00106796:
    UnityPrint(string);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnityPrintFloat(const UNITY_DOUBLE input_number)
{
    UNITY_DOUBLE number = input_number;

    /* print minus sign (including for negative zero) */
    if (number < (double)0.0f || (number == (double)0.0f && (double)1.0f / number < (double)0.0f))
    {
        UNITY_OUTPUT_CHAR('-');
        number = -number;
    }

    /* handle zero, NaN, and +/- infinity */
    if (number == (double)0.0f) UnityPrint("0");
    else if (isnan(number)) UnityPrint("nan");
    else if (isinf(number)) UnityPrint("inf");
    else
    {
        int exponent = 0;
        int decimals, digits;
        UNITY_INT32 n;
        char buf[16];

        /* scale up or down by powers of 10 */
        while (number < (double)(100000.0f / 1e6f))  { number *= (double)1e6f; exponent -= 6; }
        while (number < (double)100000.0f)         { number *= (double)10.0f; exponent--; }
        while (number > (double)(1000000.0f * 1e6f)) { number /= (double)1e6f; exponent += 6; }
        while (number > (double)1000000.0f)        { number /= (double)10.0f; exponent++; }

        /* round to nearest integer */
        n = ((UNITY_INT32)(number + number) + 1) / 2;
        if (n > 999999)
        {
            n = 100000;
            exponent++;
        }

        /* determine where to place decimal point */
        decimals = (exponent <= 0 && exponent >= -9) ? -exponent : 5;
        exponent += decimals;

        /* truncate trailing zeroes after decimal point */
        while (decimals > 0 && n % 10 == 0)
        {
            n /= 10;
            decimals--;
        }

        /* build up buffer in reverse order */
        digits = 0;
        while (n != 0 || digits < decimals + 1)
        {
            buf[digits++] = (char)('0' + n % 10);
            n /= 10;
        }
        while (digits > 0)
        {
            if(digits == decimals) UNITY_OUTPUT_CHAR('.');
            UNITY_OUTPUT_CHAR(buf[--digits]);
        }

        /* print exponent if needed */
        if (exponent != 0)
        {
            UNITY_OUTPUT_CHAR('e');

            if(exponent < 0)
            {
                UNITY_OUTPUT_CHAR('-');
                exponent = -exponent;
            }
            else
            {
                UNITY_OUTPUT_CHAR('+');
            }

            digits = 0;
            while (exponent != 0 || digits < 2)
            {
                buf[digits++] = (char)('0' + exponent % 10);
                exponent /= 10;
            }
            while (digits > 0)
            {
                UNITY_OUTPUT_CHAR(buf[--digits]);
            }
        }
    }
}